

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t HIST_count_wksp(uint *count,uint *maxSymbolValuePtr,void *source,size_t sourceSize,
                      void *workSpace,size_t workSpaceSize)

{
  size_t workSpaceSize_local;
  void *workSpace_local;
  size_t sourceSize_local;
  void *source_local;
  uint *maxSymbolValuePtr_local;
  uint *count_local;
  
  if (((ulong)workSpace & 3) == 0) {
    if (workSpaceSize < 0x1000) {
      count_local = (uint *)0xffffffffffffffbe;
    }
    else if (*maxSymbolValuePtr < 0xff) {
      count_local = (uint *)HIST_count_parallel_wksp
                                      (count,maxSymbolValuePtr,source,sourceSize,checkMaxSymbolValue
                                       ,(U32 *)workSpace);
    }
    else {
      *maxSymbolValuePtr = 0xff;
      count_local = (uint *)HIST_countFast_wksp(count,maxSymbolValuePtr,source,sourceSize,workSpace,
                                                workSpaceSize);
    }
  }
  else {
    count_local = (uint *)0xffffffffffffffff;
  }
  return (size_t)count_local;
}

Assistant:

size_t HIST_count_wksp(unsigned* count, unsigned* maxSymbolValuePtr,
                       const void* source, size_t sourceSize,
                       void* workSpace, size_t workSpaceSize)
{
    if ((size_t)workSpace & 3) return ERROR(GENERIC);  /* must be aligned on 4-bytes boundaries */
    if (workSpaceSize < HIST_WKSP_SIZE) return ERROR(workSpace_tooSmall);
    if (*maxSymbolValuePtr < 255)
        return HIST_count_parallel_wksp(count, maxSymbolValuePtr, source, sourceSize, checkMaxSymbolValue, (U32*)workSpace);
    *maxSymbolValuePtr = 255;
    return HIST_countFast_wksp(count, maxSymbolValuePtr, source, sourceSize, workSpace, workSpaceSize);
}